

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cc
# Opt level: O1

uint __thiscall
RigidBodyDynamics::Model::AddBody
          (Model *this,uint parent_id,SpatialTransform *joint_frame,Joint *joint,Body *body,
          string *body_name)

{
  pointer *ppSVar1;
  pointer *ppMVar2;
  pointer *ppMVar3;
  pointer *ppVVar4;
  pointer *ppSVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  double *pdVar6;
  uint uVar7;
  pointer pFVar8;
  iterator iVar9;
  pointer pvVar10;
  pointer pBVar11;
  pointer pBVar12;
  iterator iVar13;
  SpatialVector_t *pSVar14;
  iterator iVar15;
  iterator __position;
  iterator __position_00;
  pointer puVar16;
  iterator __position_01;
  pointer pcVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  string *__k;
  uint uVar23;
  uint uVar24;
  iterator iVar25;
  mapped_type *pmVar26;
  pointer pJVar27;
  ostream *poVar28;
  Joint *joint_00;
  int *piVar29;
  int iVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  char *pcVar34;
  _Alloc_hider _Var35;
  uint uVar36;
  ActualDstType actualDst;
  int *piVar37;
  uint movable_parent_id;
  vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
  joint_types;
  SpatialRigidBodyInertia rbi;
  SpatialTransform movable_parent_transform;
  uint local_24c;
  Body *local_248;
  pair<RigidBodyDynamics::JointType,_unsigned_int> local_240;
  SpatialVector_t local_238;
  SpatialTransform *local_208;
  string *local_200;
  SpatialMatrix_t local_1f8;
  string local_d8;
  string local_b8;
  SpatialTransform local_98;
  
  uVar24 = joint->mJointType - JointTypeRevolute;
  joint_00 = (Joint *)(ulong)uVar24;
  local_248 = body;
  if (uVar24 < 10) {
    local_98.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
    .m_data.array[0] = 1.0;
    local_98.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
    .m_data.array[1] = 0.0;
    local_98.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
    .m_data.array[2] = 0.0;
    local_98.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
    .m_data.array[3] = 0.0;
    local_98.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
    .m_data.array[4] = 1.0;
    local_98.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
    .m_data.array[5] = 0.0;
    local_98.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
    .m_data.array[6] = 0.0;
    local_98.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
    .m_data.array[7] = 0.0;
    local_98.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
    .m_data.array[8] = 1.0;
    local_98.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
    .m_data.array[0] = 0.0;
    local_98.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
    .m_data.array[1] = 0.0;
    local_98.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
    .m_data.array[2] = 0.0;
    uVar32 = (ulong)(parent_id - this->fixed_body_discriminator);
    local_24c = parent_id;
    if ((parent_id != 0xffffffff && this->fixed_body_discriminator <= parent_id) &&
       (uVar31 = ((long)(this->mFixedBodies).
                        super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                        .
                        super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->mFixedBodies).
                        super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                        .
                        super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x79435e50d79435e5,
       uVar32 <= uVar31 && uVar31 - uVar32 != 0)) {
      pFVar8 = (this->mFixedBodies).
               super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               .
               super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_24c = pFVar8[uVar32].mMovableParent;
      local_98.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] = *(double *)&pFVar8[uVar32].mParentTransform.E;
      local_98.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[1] = *(double *)((long)&pFVar8[uVar32].mParentTransform.E + 8);
      pdVar6 = (double *)((long)&pFVar8[uVar32].mParentTransform.E + 0x10);
      local_98.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[2] = *pdVar6;
      local_98.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[3] = pdVar6[1];
      pdVar6 = (double *)((long)&pFVar8[uVar32].mParentTransform.E + 0x20);
      local_98.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[4] = *pdVar6;
      local_98.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[5] = pdVar6[1];
      pdVar6 = (double *)((long)&pFVar8[uVar32].mParentTransform.E + 0x30);
      local_98.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[6] = *pdVar6;
      local_98.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[7] = pdVar6[1];
      local_98.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[8] = *(double *)((long)&pFVar8[uVar32].mParentTransform.E + 0x40);
      local_98.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[0] = *(double *)&pFVar8[uVar32].mParentTransform.r.super_Vector3d;
      local_98.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[1] = *(double *)((long)&pFVar8[uVar32].mParentTransform.r + 8);
      local_98.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[2] = *(double *)((long)&pFVar8[uVar32].mParentTransform.r + 0x10);
    }
    iVar9._M_current =
         (this->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_208 = joint_frame;
    local_200 = body_name;
    if (iVar9._M_current ==
        (this->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,iVar9,&local_24c);
    }
    else {
      *iVar9._M_current = local_24c;
      (this->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar9._M_current + 1;
    }
    if (joint->mDoFCount != 0) {
      pJVar27 = (this->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar24 = pJVar27[-1].q_index;
      uVar7 = pJVar27[-1].mDoFCount;
      uVar36 = 0;
      do {
        uVar23 = uVar36 + uVar24 + uVar7;
        local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
             (double)CONCAT44(local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0]._4_4_,uVar23);
        iVar9._M_current =
             (this->lambda_q).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            (this->lambda_q).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&this->lambda_q,iVar9,(uint *)&local_1f8);
        }
        else {
          *iVar9._M_current = uVar23;
          (this->lambda_q).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar9._M_current + 1;
        }
        uVar36 = uVar36 + 1;
      } while (uVar36 < joint->mDoFCount);
    }
    local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 0.0;
    local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
    local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
    std::
    vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
    ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
              ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                *)&this->mu,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1f8);
    if ((void *)local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [0] != (void *)0x0) {
      operator_delete((void *)local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0],
                      (long)local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[2] -
                      (long)local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[0]);
    }
    uVar31 = (ulong)local_24c;
    pvVar10 = (this->mu).
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar32 = ((long)(this->mu).
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar10 >> 3) *
             -0x5555555555555555;
    if (uVar32 < uVar31 || uVar32 - uVar31 == 0) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    else {
      this_00 = pvVar10 + uVar31;
      uVar24 = (int)((ulong)((long)(this->mBodies).
                                   super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                                   .
                                   super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->mBodies).
                                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                                  .
                                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
           (double)CONCAT44(local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[0]._4_4_,uVar24);
      iVar9._M_current =
           (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (this_00,iVar9,(uint *)&local_1f8);
      }
      else {
        *iVar9._M_current = uVar24;
        (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar9._M_current + 1;
      }
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 1.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 1.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8] = 1.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[9] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[10] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb] = 0.0
      ;
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::emplace_back<RigidBodyDynamics::Math::SpatialTransform>
                (&(this->X_lambda).
                  super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ,(SpatialTransform *)&local_1f8);
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 1.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 1.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8] = 1.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[9] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[10] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb] = 0.0
      ;
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::emplace_back<RigidBodyDynamics::Math::SpatialTransform>
                (&(this->X_base).
                  super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ,(SpatialTransform *)&local_1f8);
      std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
      push_back(&(this->mBodies).
                 super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                ,local_248);
      __k = local_200;
      if (local_200->_M_string_length != 0) {
        iVar25 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::find(&(this->mBodyNameMap)._M_t,local_200);
        if ((_Rb_tree_header *)iVar25._M_node !=
            &(this->mBodyNameMap)._M_t._M_impl.super__Rb_tree_header) {
          poVar28 = std::operator<<((ostream *)&std::cerr,"Error: Body with name \'");
          poVar28 = std::operator<<(poVar28,(string *)__k);
          pcVar34 = "\' already exists!";
          goto LAB_0013a189;
        }
        pBVar11 = (this->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pBVar12 = (this->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pmVar26 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ::operator[](&this->mBodyNameMap,__k);
        *pmVar26 = (int)((ulong)((long)pBVar11 - (long)pBVar12) >> 4) * -0x49249249 - 1;
      }
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      iVar13._M_current =
           (this->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar13._M_current ==
          (this->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
        _M_realloc_insert<SpatialVector_t>
                  (&(this->v).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,iVar13
                   ,(SpatialVector_t *)&local_1f8);
      }
      else {
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0
        ;
        ppSVar1 = &(this->v).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      iVar13._M_current =
           (this->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar13._M_current ==
          (this->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
        _M_realloc_insert<SpatialVector_t>
                  (&(this->a).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,iVar13
                   ,(SpatialVector_t *)&local_1f8);
      }
      else {
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0
        ;
        ppSVar1 = &(this->a).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      uVar24 = (int)((ulong)((long)(this->mJoints).
                                   super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                   .
                                   super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->mJoints).
                                  super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                  .
                                  super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 - 1
      ;
      std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
      push_back(&(this->mJoints).
                 super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ,joint);
      pJVar27 = (this->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (this->mJoints).
      super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>.
      super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].q_index =
           pJVar27[uVar24].mDoFCount + pJVar27[uVar24].q_index;
      pSVar14 = joint->mJointAxes;
      iVar13._M_current =
           (this->S).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar13._M_current ==
          (this->S).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>>::
        _M_realloc_insert<SpatialVector_t_const&>
                  ((vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *)&this->S,
                   iVar13,pSVar14);
      }
      else {
        dVar18 = (pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [0];
        dVar19 = (pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [1];
        dVar20 = (pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [2];
        dVar21 = (pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [3];
        dVar22 = (pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [5];
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
             (pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
             dVar22;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
             dVar20;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
             dVar21;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             dVar18;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
             dVar19;
        ppSVar1 = &(this->S).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 1.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 1.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8] = 1.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[9] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[10] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb] = 0.0
      ;
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::emplace_back<RigidBodyDynamics::Math::SpatialTransform>
                (&(this->X_J).
                  super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ,(SpatialTransform *)&local_1f8);
      pSVar14 = joint->mJointAxes;
      iVar13._M_current =
           (this->v_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar13._M_current ==
          (this->v_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>>::
        _M_realloc_insert<SpatialVector_t_const&>
                  ((vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *)&this->v_J,
                   iVar13,pSVar14);
      }
      else {
        dVar18 = (pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [0];
        dVar19 = (pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [1];
        dVar20 = (pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [2];
        dVar21 = (pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [3];
        dVar22 = (pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [5];
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
             (pSVar14->super_Matrix<double,_6,_1,_0,_6,_1>).
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
             dVar22;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
             dVar20;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
             dVar21;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             dVar18;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
             dVar19;
        ppSVar1 = &(this->v_J).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      iVar13._M_current =
           (this->c_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar13._M_current ==
          (this->c_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
        _M_realloc_insert<SpatialVector_t>
                  (&(this->c_J).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,iVar13
                   ,(SpatialVector_t *)&local_1f8);
      }
      else {
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0
        ;
        ppSVar1 = &(this->c_J).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      memset(&local_1f8,0,0x90);
      iVar15._M_current =
           (this->multdof3_S).
           super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
           .
           super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar15._M_current ==
          (this->multdof3_S).
          super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
          .
          super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
        ::_M_realloc_insert<Eigen::Matrix<double,6,3,0,6,3>>
                  ((vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
                    *)&this->multdof3_S,iVar15,(Matrix<double,_6,_3,_0,_6,_3> *)&local_1f8);
      }
      else {
        memset(iVar15._M_current,0,0x90);
        ppMVar2 = &(this->multdof3_S).
                   super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                   .
                   super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppMVar2 = *ppMVar2 + 1;
      }
      memset(&local_1f8,0,0x90);
      iVar15._M_current =
           (this->multdof3_U).
           super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
           .
           super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar15._M_current ==
          (this->multdof3_U).
          super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
          .
          super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
        ::_M_realloc_insert<Eigen::Matrix<double,6,3,0,6,3>>
                  ((vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
                    *)&this->multdof3_U,iVar15,(Matrix<double,_6,_3,_0,_6,_3> *)&local_1f8);
      }
      else {
        memset(iVar15._M_current,0,0x90);
        ppMVar2 = &(this->multdof3_U).
                   super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                   .
                   super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppMVar2 = *ppMVar2 + 1;
      }
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8] = 0.0;
      __position._M_current =
           (this->multdof3_Dinv).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->multdof3_Dinv).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::_M_realloc_insert<Matrix3_t>
                  (&this->multdof3_Dinv,__position,(Matrix3_t *)&local_1f8);
      }
      else {
        ((__position._M_current)->super_Matrix3d).
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0
        ;
        ((__position._M_current)->super_Matrix3d).
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0
        ;
        ((__position._M_current)->super_Matrix3d).
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 0.0
        ;
        ((__position._M_current)->super_Matrix3d).
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0
        ;
        ((__position._M_current)->super_Matrix3d).
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0
        ;
        ((__position._M_current)->super_Matrix3d).
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0
        ;
        ((__position._M_current)->super_Matrix3d).
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0
        ;
        ((__position._M_current)->super_Matrix3d).
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0
        ;
        ((__position._M_current)->super_Matrix3d).
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 0.0
        ;
        ppMVar3 = &(this->multdof3_Dinv).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppMVar3 = *ppMVar3 + 1;
      }
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      __position_00._M_current =
           (this->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Vector3_t,_std::allocator<Vector3_t>_>::_M_realloc_insert<Vector3_t>
                  (&this->multdof3_u,__position_00,(Vector3_t *)&local_1f8);
      }
      else {
        ((__position_00._M_current)->super_Vector3d).
        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0
        ;
        ((__position_00._M_current)->super_Vector3d).
        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = 0.0
        ;
        ((__position_00._M_current)->super_Vector3d).
        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = 0.0
        ;
        ppVVar4 = &(this->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppVVar4 = *ppVVar4 + 1;
      }
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
           (double)((ulong)local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[0] & 0xffffffff00000000);
      iVar9._M_current =
           (this->multdof3_w_index).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (this->multdof3_w_index).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&this->multdof3_w_index,iVar9,(uint *)&local_1f8);
      }
      else {
        *iVar9._M_current = 0;
        (this->multdof3_w_index).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar9._M_current + 1;
      }
      this->dof_count = this->dof_count + joint->mDoFCount;
      pJVar27 = (this->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar32 = ((long)(this->mJoints).
                      super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pJVar27 >> 3) *
               -0x5555555555555555;
      iVar30 = 0;
      if (1 < uVar32) {
        puVar16 = (this->multdof3_w_index).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar30 = 0;
        uVar31 = 1;
        uVar24 = 2;
        do {
          if (pJVar27[uVar31].mJointType == JointTypeSpherical) {
            puVar16[uVar31] = this->dof_count + iVar30;
            iVar30 = iVar30 + 1;
          }
          uVar31 = (ulong)uVar24;
          uVar24 = uVar24 + 1;
        } while (uVar31 <= uVar32 && uVar32 - uVar31 != 0);
      }
      this->q_size = iVar30 + this->dof_count;
      this->qdot_size = this->qdot_size + joint->mDoFCount;
      Math::SpatialTransform::operator*((SpatialTransform *)&local_1f8,local_208,&local_98);
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::emplace_back<RigidBodyDynamics::Math::SpatialTransform>
                (&(this->X_T).
                  super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ,(SpatialTransform *)&local_1f8);
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      iVar13._M_current =
           (this->c).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar13._M_current ==
          (this->c).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
        _M_realloc_insert<SpatialVector_t>
                  (&(this->c).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,iVar13
                   ,(SpatialVector_t *)&local_1f8);
      }
      else {
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0
        ;
        ppSVar1 = &(this->c).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      memset(&local_1f8,0,0x120);
      __position_01._M_current =
           (this->IA).super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
           super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_01._M_current ==
          (this->IA).super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
          super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::
        _M_realloc_insert<SpatialMatrix_t>
                  (&(this->IA).
                    super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>,
                   __position_01,&local_1f8);
      }
      else {
        memset(__position_01._M_current,0,0x120);
        ppSVar5 = &(this->IA).
                   super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                   super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar5 = *ppSVar5 + 1;
      }
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      iVar13._M_current =
           (this->pA).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar13._M_current ==
          (this->pA).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
        _M_realloc_insert<SpatialVector_t>
                  (&(this->pA).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,iVar13
                   ,(SpatialVector_t *)&local_1f8);
      }
      else {
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0
        ;
        ppSVar1 = &(this->pA).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      iVar13._M_current =
           (this->U).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar13._M_current ==
          (this->U).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
        _M_realloc_insert<SpatialVector_t>
                  (&(this->U).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,iVar13
                   ,(SpatialVector_t *)&local_1f8);
      }
      else {
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0
        ;
        ppSVar1 = &(this->U).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      lVar33 = ((long)(this->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      if ((this->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          != lVar33) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&(this->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar33,
                   1);
      }
      lVar33 = (this->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
      if (0 < lVar33) {
        memset((this->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data,0,lVar33 << 3);
      }
      lVar33 = ((long)(this->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      if ((this->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          != lVar33) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&(this->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar33,
                   1);
      }
      lVar33 = (this->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
      if (0 < lVar33) {
        memset((this->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data,0,lVar33 << 3);
      }
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 0.0;
      local_1f8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      iVar13._M_current =
           (this->f).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar13._M_current ==
          (this->f).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
        _M_realloc_insert<SpatialVector_t>
                  (&(this->f).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,iVar13
                   ,(SpatialVector_t *)&local_1f8);
      }
      else {
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0
        ;
        ppSVar1 = &(this->f).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      Math::SpatialRigidBodyInertia::createFromMassComInertiaC
                ((SpatialRigidBodyInertia *)&local_1f8,local_248->mMass,&local_248->mCenterOfMass,
                 &local_248->mInertia);
      std::
      vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
      ::push_back(&(this->Ic).
                   super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                  ,(SpatialRigidBodyInertia *)&local_1f8);
      std::
      vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
      ::push_back(&(this->I).
                   super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                  ,(SpatialRigidBodyInertia *)&local_1f8);
      local_238.super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
      local_238.super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
      local_238.super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
      local_238.super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
      local_238.super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
      local_238.super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
      iVar13._M_current =
           (this->hc).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar13._M_current ==
          (this->hc).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
        _M_realloc_insert<SpatialVector_t>
                  (&(this->hc).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,iVar13
                   ,&local_238);
      }
      else {
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0
        ;
        ((iVar13._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0
        ;
        ppSVar1 = &(this->hc).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      lVar33 = ((long)(this->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      if (lVar33 - (ulong)this->fixed_body_discriminator != 0) {
        this->previously_added_body_id = (int)lVar33 - 1;
        puVar16 = (this->mJointUpdateOrder).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((this->mJointUpdateOrder).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish != puVar16) {
          (this->mJointUpdateOrder).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar16;
        }
        local_238.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0
        ;
        local_238.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0
        ;
        local_238.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0
        ;
        pJVar27 = (this->mJoints).
                  super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((this->mJoints).
            super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            .
            super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            ._M_impl.super__Vector_impl_data._M_finish != pJVar27) {
          uVar32 = 0;
          do {
            local_240.first = pJVar27[uVar32].mJointType;
            local_240.second = (uint)uVar32;
            std::
            vector<std::pair<RigidBodyDynamics::JointType,unsigned_int>,std::allocator<std::pair<RigidBodyDynamics::JointType,unsigned_int>>>
            ::emplace_back<std::pair<RigidBodyDynamics::JointType,unsigned_int>>
                      ((vector<std::pair<RigidBodyDynamics::JointType,unsigned_int>,std::allocator<std::pair<RigidBodyDynamics::JointType,unsigned_int>>>
                        *)&local_238,&local_240);
            local_240.first =
                 (this->mJoints).
                 super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar32].mJointType;
            iVar9._M_current =
                 (this->mJointUpdateOrder).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar9._M_current ==
                (this->mJointUpdateOrder).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(&this->mJointUpdateOrder,iVar9,&local_240.first);
            }
            else {
              *iVar9._M_current = local_240.first;
              (this->mJointUpdateOrder).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar9._M_current + 1;
            }
            uVar32 = (ulong)((uint)uVar32 + 1);
            pJVar27 = (this->mJoints).
                      super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar31 = ((long)(this->mJoints).
                            super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                            .
                            super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pJVar27 >> 3) *
                     -0x5555555555555555;
          } while (uVar32 <= uVar31 && uVar31 - uVar32 != 0);
        }
        puVar16 = (this->mJointUpdateOrder).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((this->mJointUpdateOrder).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish != puVar16) {
          (this->mJointUpdateOrder).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar16;
        }
        while (local_238.super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [1] != local_238.super_Matrix<double,_6,_1,_0,_6,_1>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array[0]) {
          if (local_238.super_Matrix<double,_6,_1,_0,_6,_1>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
              != local_238.super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [1]) {
            iVar30 = *(int *)local_238.super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                             m_data.array[0];
            piVar37 = (int *)local_238.super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                             m_data.array[0];
            do {
              if (*piVar37 == iVar30) {
                iVar9._M_current =
                     (this->mJointUpdateOrder).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar9._M_current ==
                    (this->mJointUpdateOrder).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                             &this->mJointUpdateOrder,iVar9,(uint *)(piVar37 + 1));
                }
                else {
                  *iVar9._M_current = piVar37[1];
                  (this->mJointUpdateOrder).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar9._M_current + 1;
                }
                piVar29 = piVar37 + 2;
                if ((piVar29 !=
                     (int *)local_238.super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                            m_data.array[1]) &&
                   (lVar33 = (long)local_238.super_Matrix<double,_6,_1,_0,_6,_1>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[1] - (long)piVar29 >> 3, 0 < lVar33)) {
                  lVar33 = lVar33 + 1;
                  do {
                    *(undefined8 *)(piVar29 + -2) = *(undefined8 *)piVar29;
                    piVar29 = piVar29 + 2;
                    lVar33 = lVar33 + -1;
                  } while (1 < lVar33);
                }
                local_238.super_Matrix<double,_6,_1,_0,_6,_1>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                [1] = (double)((long)local_238.super_Matrix<double,_6,_1,_0,_6,_1>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                     m_storage.m_data.array[1] + -8);
              }
              else {
                piVar37 = piVar37 + 2;
              }
            } while (piVar37 !=
                     (int *)local_238.super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                            m_data.array[1]);
          }
        }
        uVar24 = this->previously_added_body_id;
        if ((int *)local_238.super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] == (int *)0x0) {
          return uVar24;
        }
        operator_delete((void *)local_238.super_Matrix<double,_6,_1,_0,_6,_1>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[0],
                        (long)local_238.super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array[2] -
                        (long)local_238.super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array[0]);
        return uVar24;
      }
    }
    poVar28 = std::operator<<((ostream *)&std::cerr,"Error: cannot add more than ");
    poVar28 = (ostream *)std::ostream::operator<<(poVar28,this->fixed_body_discriminator);
    pcVar34 = " movable bodies. You need to modify Model::fixed_body_discriminator for this.";
LAB_0013a189:
    poVar28 = std::operator<<(poVar28,pcVar34);
    std::endl<char,std::char_traits<char>>(poVar28);
    abort();
  }
  if (joint->mJointType == JointTypeFixed) {
    pcVar17 = (body_name->_M_dataplus)._M_p;
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,pcVar17,pcVar17 + body_name->_M_string_length);
    uVar24 = AddBodyFixedJoint(this,parent_id,joint_frame,joint_00,local_248,&local_b8);
    this->previously_added_body_id = uVar24;
    local_d8.field_2._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
    _Var35._M_p = local_b8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == &local_b8.field_2) goto LAB_0013a115;
  }
  else {
    pcVar17 = (body_name->_M_dataplus)._M_p;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar17,pcVar17 + body_name->_M_string_length);
    uVar24 = AddBodyMultiDofJoint(this,parent_id,joint_frame,joint,local_248,&local_d8);
    this->previously_added_body_id = uVar24;
    _Var35._M_p = local_d8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == &local_d8.field_2) goto LAB_0013a115;
  }
  operator_delete(_Var35._M_p,local_d8.field_2._M_allocated_capacity + 1);
LAB_0013a115:
  return this->previously_added_body_id;
}

Assistant:

unsigned int Model::AddBody (const unsigned int parent_id,
		const SpatialTransform &joint_frame,
		const Joint &joint,
		const Body &body,
		std::string body_name) {
	assert (lambda.size() > 0);
	assert (joint.mJointType != JointTypeUndefined);

	if (joint.mJointType == JointTypeFixed) {
		previously_added_body_id = AddBodyFixedJoint (*this, parent_id, joint_frame, joint, body, body_name);
		return previously_added_body_id;
	} else if ( (joint.mJointType == JointTypeSpherical) 
			|| (joint.mJointType == JointTypeEulerZYX) 
			|| (joint.mJointType == JointTypeEulerXYZ) 
			|| (joint.mJointType == JointTypeEulerYXZ) 
			|| (joint.mJointType == JointTypeTranslationXYZ) ) {
		// no action required
	} else if (joint.mJointType != JointTypePrismatic 
			&& joint.mJointType != JointTypeRevolute
			&& joint.mJointType != JointTypeRevoluteX
			&& joint.mJointType != JointTypeRevoluteY
			&& joint.mJointType != JointTypeRevoluteZ
			) {
		previously_added_body_id = AddBodyMultiDofJoint (*this, parent_id, joint_frame, joint, body, body_name);
		return previously_added_body_id;
	}

	// If we add the body to a fixed body we have to make sure that we
	// actually add it to its movable parent.
	unsigned int movable_parent_id = parent_id;
	SpatialTransform movable_parent_transform;

	if (IsFixedBodyId(parent_id)) {
		unsigned int fbody_id = parent_id - fixed_body_discriminator;
		movable_parent_id = mFixedBodies[fbody_id].mMovableParent;
		movable_parent_transform = mFixedBodies[fbody_id].mParentTransform;
	}

	// structural information
	lambda.push_back(movable_parent_id);
	unsigned int lambda_q_last = mJoints[mJoints.size() - 1].q_index;
	if (mJoints[mJoints.size() - 1].mDoFCount > 0)
		lambda_q_last = lambda_q_last + mJoints[mJoints.size() - 1].mDoFCount;
	for (unsigned int i = 0; i < joint.mDoFCount; i++) {
		lambda_q.push_back(lambda_q_last + i);
	}
	mu.push_back(std::vector<unsigned int>());
	mu.at(movable_parent_id).push_back(mBodies.size());

	// Bodies
	X_lambda.push_back(SpatialTransform());
	X_base.push_back(SpatialTransform());
	mBodies.push_back(body);

	if (body_name.size() != 0) {
		if (mBodyNameMap.find(body_name) != mBodyNameMap.end()) {
			std::cerr << "Error: Body with name '" << body_name << "' already exists!" << std::endl;
			assert (0);
			abort();
		}
		mBodyNameMap[body_name] = mBodies.size() - 1;
	}

	// state information
	v.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));
	a.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));

	// Joints
	unsigned int last_q_index = mJoints.size() - 1;
	mJoints.push_back(joint);
	mJoints[mJoints.size() - 1].q_index = mJoints[last_q_index].q_index + mJoints[last_q_index].mDoFCount; 

	S.push_back (joint.mJointAxes[0]);

	// Joint state variables
	X_J.push_back (SpatialTransform());
	v_J.push_back (joint.mJointAxes[0]);
	c_J.push_back (SpatialVector(0., 0., 0., 0., 0., 0.));

	// workspace for joints with 3 dof
	multdof3_S.push_back (Matrix63::Zero(6,3));
	multdof3_U.push_back (Matrix63::Zero());
	multdof3_Dinv.push_back (Matrix3d::Zero());
	multdof3_u.push_back (Vector3d::Zero());
	multdof3_w_index.push_back (0);

	dof_count = dof_count + joint.mDoFCount;

	// update the w components of the Quaternions. They are stored at the end
	// of the q vector
	int multdof3_joint_counter = 0;
	for (unsigned int i = 1; i < mJoints.size(); i++) {
		if (mJoints[i].mJointType == JointTypeSpherical) {
			multdof3_w_index[i] = dof_count + multdof3_joint_counter;
			multdof3_joint_counter++;
		}
	}

	q_size = dof_count + multdof3_joint_counter;
	qdot_size = qdot_size + joint.mDoFCount;

	// we have to invert the transformation as it is later always used from the
	// child bodies perspective.
	X_T.push_back(joint_frame * movable_parent_transform);

	// Dynamic variables
	c.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));
	IA.push_back(SpatialMatrix::Zero(6,6));
	pA.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));
	U.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));

	d = VectorNd::Zero (mBodies.size());
	u = VectorNd::Zero (mBodies.size());

	f.push_back (SpatialVector (0., 0., 0., 0., 0., 0.));

	SpatialRigidBodyInertia rbi = SpatialRigidBodyInertia::createFromMassComInertiaC (body.mMass, body.mCenterOfMass, body.mInertia);

	Ic.push_back (rbi);
	I.push_back (rbi);
	hc.push_back (SpatialVector(0., 0., 0., 0., 0., 0.));

	if (mBodies.size() == fixed_body_discriminator) {
		std::cerr << "Error: cannot add more than " << fixed_body_discriminator << " movable bodies. You need to modify Model::fixed_body_discriminator for this." << std::endl;
		assert (0);
		abort();
	}
	
	previously_added_body_id = mBodies.size() - 1;

	mJointUpdateOrder.clear();

	// update the joint order computation
	std::vector<std::pair<JointType, unsigned int> > joint_types;
	for (unsigned int i = 0; i < mJoints.size(); i++) {
		joint_types.push_back (std::pair<JointType, unsigned int> (mJoints[i].mJointType,i));
		mJointUpdateOrder.push_back (mJoints[i].mJointType);
	}

	mJointUpdateOrder.clear();
	JointType current_joint_type = JointTypeUndefined;
	while (joint_types.size() != 0) {
		current_joint_type = joint_types[0].first;

		std::vector<std::pair<JointType, unsigned int> >::iterator type_iter = joint_types.begin();

		while (type_iter != joint_types.end()) {
			if (type_iter->first == current_joint_type) {
				mJointUpdateOrder.push_back (type_iter->second);
				type_iter = joint_types.erase (type_iter);
			} else {
				++type_iter;
			}
		}
	}

//	for (unsigned int i = 0; i < mJointUpdateOrder.size(); i++) {
//		std::cout << "i = " << i << ": joint_id = " << mJointUpdateOrder[i] << " joint_type = " << mJoints[mJointUpdateOrder[i]].mJointType << std::endl;
//	}

	return previously_added_body_id;
}